

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

bool units::precise::custom::is_custom_unit(unit_data *UT)

{
  int iVar1;
  int32_t iVar2;
  long lVar3;
  unit_data *in_RDI;
  undefined1 local_1;
  
  iVar1 = units::detail::unit_data::mole(in_RDI);
  iVar2 = units::detail::maxNeg(2);
  if (iVar1 == iVar2) {
    iVar1 = units::detail::unit_data::ampere(in_RDI);
    lVar3 = (long)iVar1;
    if (lVar3 < 1) {
      lVar3 = -lVar3;
    }
    if (lVar3 < 2) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

inline bool is_custom_unit(const detail::unit_data& UT)
        {
            if (UT.mole() != detail::maxNeg(detail::bitwidth::mole)) {
                // mole is always -2 regardless of inversion
                return false;
            }
            if (std::labs(UT.ampere()) < 2) {
                // ampere is either -3 or -4  or 3 or 4
                return false;
            }
            return true;
        }